

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode TA_FuncTableAlloc(char *group,TA_StringTable **table)

{
  uint uVar1;
  TA_RetCode TVar2;
  int iVar3;
  TA_StringTable *table_00;
  char **ppcVar4;
  ulong uVar5;
  uint i;
  long lVar6;
  
  TVar2 = TA_BAD_PARAM;
  if (table != (TA_StringTable **)0x0 && group != (char *)0x0) {
    *table = (TA_StringTable *)0x0;
    lVar6 = 0;
    do {
      iVar3 = strcmp(TA_GroupString[lVar6],group);
      if (iVar3 == 0) {
        uVar1 = TA_PerGroupSize[lVar6];
        table_00 = (TA_StringTable *)calloc(1,0x1c);
        if (table_00 == (TA_StringTable *)0x0) {
          *table = (TA_StringTable *)0x0;
        }
        else {
          table_00[1].size = 0xa20cb20c;
          table_00->hiddenData = table_00 + 1;
          table_00->size = uVar1;
          if (uVar1 == 0) goto LAB_0018dd1a;
          ppcVar4 = (char **)calloc(1,(ulong)uVar1 * 8);
          table_00->string = ppcVar4;
          if (ppcVar4 != (char **)0x0) {
            uVar5 = 0;
            do {
              table_00->string[uVar5] = TA_PerGroupFuncDef[lVar6][uVar5]->funcInfo->name;
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
LAB_0018dd1a:
            *table = table_00;
            return TA_SUCCESS;
          }
          *table = (TA_StringTable *)0x0;
          TA_FuncTableFree(table_00);
        }
        return TA_ALLOC_ERR;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    TVar2 = TA_GROUP_NOT_FOUND;
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_FuncTableAlloc( const char *group, TA_StringTable **table )
{
   TA_RetCode retCode;
   unsigned int i;
   TA_StringTable *stringTable;
   unsigned int groupId; /* TA_GroupId */
   unsigned int groupSize;
   const char *stringPtr;
   TA_StringTablePriv *stringTablePriv;

   if( (group == NULL) || (table == NULL ) )
   {
      return TA_BAD_PARAM;
   }

   *table = NULL;
   stringPtr = NULL;

   /* Get information on the group. */
   retCode = getGroupId( group, &groupId );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   retCode = getGroupSize( (TA_GroupId)groupId, &groupSize );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   /* Allocate the table. */

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_FUNC_MAGIC_NB;
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */
   stringTable->size = groupSize;
   if( groupSize != 0 )
   {
      stringTable->string = (const char **)TA_Malloc( (stringTable->size) *
                                                      sizeof(const char *) );

      if( stringTable->string == NULL )
      {
         *table = NULL;
         TA_FuncTableFree( stringTable );
         return TA_ALLOC_ERR;
      }

      memset( (void *)stringTable->string, 0,
              (stringTable->size) * sizeof(const char *) );

      for( i=0; i < stringTable->size; i++ )
      {
         retCode = getFuncNameByIdx( (TA_GroupId)groupId, i, &stringPtr );

         if( retCode != TA_SUCCESS )
         {
            *table = NULL;
            TA_FuncTableFree( stringTable );
            return TA_ALLOC_ERR;
         }

         (stringTable->string)[i] = stringPtr;
      }
   }

   /* Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}